

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_actor.hpp
# Opt level: O2

void __thiscall
cpp_properties::
properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
::~properties_actor(properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
                    *this)

{
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::tuple<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::tuple<std::__cxx11::string,std::__cxx11::string>>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  *this_01;
  pointer_type __args;
  pointer_type ppVar1;
  
  this_00 = &this->property;
  if ((this->property).super_type.m_initialized == true) {
    this_01 = (_Rb_tree<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::tuple<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::tuple<std::__cxx11::string,std::__cxx11::string>>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
               *)this->properties;
    __args = boost::
             optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(this_00);
    ppVar1 = boost::
             optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(this_00);
    std::
    _Rb_tree<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::tuple<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::tuple<std::__cxx11::string,std::__cxx11::string>>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
              (this_01,&__args->first,&ppVar1->second);
  }
  boost::optional_detail::
  optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional_base(&this_00->super_type);
  return;
}

Assistant:

~properties_actor() {
    if (property) {
      emplacer_policy::emplace(properties, std::move(property->first), std::move(property->second));
    }
  }